

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O3

file_id * idx2::ConstructFilePath
                    (file_id *__return_storage_ptr__,idx2_file *Idx2,u64 Brick,i8 Level,i8 Subband,
                    i16 BpKey)

{
  bool bVar1;
  file_id *pfVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  undefined7 in_register_00000009;
  int iVar7;
  u64 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  long *in_FS_OFFSET;
  printer local_70;
  uint local_54;
  char *local_50;
  file_id *local_48;
  long local_40;
  u64 local_38;
  
  pcVar11 = (char *)(*in_FS_OFFSET + -0x100);
  local_38 = Brick;
  printer::printer(&local_70,pcVar11,0x100);
  if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
    if ((long)local_70.Size < 2) {
      pcVar11 = "false && \"buffer too small\"";
LAB_00192ae6:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x60,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    iVar7 = snprintf(local_70.Buf,(long)local_70.Size,"%.*s/%s/%s/",(ulong)(uint)(Idx2->Dir).Size,
                     (Idx2->Dir).field_0.Ptr,Idx2,Idx2->Field);
    local_70.Buf = local_70.Buf + iVar7;
    iVar3 = local_70.Size - iVar7;
    bVar1 = local_70.Size < iVar7;
    local_70.Size = iVar3;
    if (iVar3 == 0 || bVar1) {
      pcVar11 = "false && \"buffer overflow?\"";
      goto LAB_00192ae6;
    }
  }
  else {
    if ((local_70.Buf != (char *)0x0) || ((FILE *)local_70.File == (FILE *)0x0)) {
      pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_00192ae6;
    }
    fprintf((FILE *)local_70.File,"%.*s/%s/%s/",(ulong)(uint)(Idx2->Dir).Size,
            (Idx2->Dir).field_0.Ptr,Idx2,Idx2->Field);
  }
  local_50 = pcVar11;
  local_48 = __return_storage_ptr__;
  if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
    if ((long)local_70.Size < 2) {
      pcVar11 = "false && \"buffer too small\"";
LAB_00192b17:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x61,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    iVar3 = snprintf(local_70.Buf,(long)local_70.Size,"/L%02x",(ulong)(uint)(int)Level);
    local_70.Buf = local_70.Buf + iVar3;
    iVar7 = local_70.Size - iVar3;
    if (local_70.Size - iVar3 == 0 || local_70.Size < iVar3) {
      pcVar11 = "false && \"buffer overflow?\"";
      goto LAB_00192b17;
    }
  }
  else {
    if ((local_70.Buf != (char *)0x0) || ((FILE *)local_70.File == (FILE *)0x0)) {
      pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_00192b17;
    }
    fprintf((FILE *)local_70.File,"/L%02x",(ulong)(uint)(int)Level);
    iVar7 = local_70.Size;
  }
  local_70.Size = iVar7;
  if ('\x0f' < Level) {
    pcVar11 = 
    "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
    ;
LAB_00192a7b:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,pcVar11);
  }
  local_54 = (uint)CONCAT71(in_register_00000009,Level);
  lVar4 = (long)Level;
  local_40 = lVar4;
  if (1 < (Idx2->FilesDirsDepth).Arr[lVar4].Len) {
    uVar8 = local_38;
    lVar9 = 0;
    do {
      if (lVar9 == 4) {
        pcVar11 = 
        "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]";
        goto LAB_00192a7b;
      }
      cVar5 = (Idx2->FilesDirsDepth).Arr[lVar4].Arr[lVar9] -
              (Idx2->BricksOrderStr).Buffer.Data[lVar4 * 0x81 + 0x80];
      if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
        if ((long)local_70.Size < 2) {
          pcVar11 = "false && \"buffer too small\"";
LAB_00192a9e:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                        ,0x62,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)"
                       );
        }
        bVar6 = -cVar5;
        iVar3 = snprintf(local_70.Buf,(long)local_70.Size,"/B%lx",
                         ((uVar8 >> (bVar6 & 0x3f)) << (bVar6 & 0x3f)) >> (bVar6 & 0x3f));
        local_70.Buf = local_70.Buf + iVar3;
        iVar7 = local_70.Size - iVar3;
        if (local_70.Size - iVar3 == 0 || local_70.Size < iVar3) {
          pcVar11 = "false && \"buffer overflow?\"";
          goto LAB_00192a9e;
        }
      }
      else {
        if ((local_70.Buf != (char *)0x0) || ((FILE *)local_70.File == (FILE *)0x0)) {
          pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
          goto LAB_00192a9e;
        }
        bVar6 = -cVar5;
        fprintf((FILE *)local_70.File,"/B%lx",
                ((uVar8 >> (bVar6 & 0x3f)) << (bVar6 & 0x3f)) >> (bVar6 & 0x3f));
        iVar7 = local_70.Size;
      }
      local_70.Size = iVar7;
      uVar8 = uVar8 << ((Idx2->FilesDirsDepth).Arr[lVar4].Arr[lVar9] & 0x3fU);
      uVar10 = lVar9 + 2;
      lVar9 = lVar9 + 1;
    } while (uVar10 < (Idx2->FilesDirsDepth).Arr[lVar4].Len);
  }
  pfVar2 = local_48;
  pcVar11 = local_50;
  if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
    if ((long)local_70.Size < 2) {
      pcVar11 = "false && \"buffer too small\"";
    }
    else {
      iVar3 = snprintf(local_70.Buf,(long)local_70.Size,".bin");
      local_70.Buf = local_70.Buf + iVar3;
      iVar7 = local_70.Size - iVar3;
      if (iVar7 != 0 && iVar3 <= local_70.Size) goto LAB_00192a05;
      pcVar11 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_70.Buf == (char *)0x0) && ((FILE *)local_70.File != (FILE *)0x0)) {
      fwrite(".bin",4,1,(FILE *)local_70.File);
      iVar7 = local_70.Size;
LAB_00192a05:
      uVar10 = (ulong)(Idx2->BricksPerFile).Arr[local_40];
      lVar4 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      bVar6 = -(uVar10 == 0) | (byte)lVar4;
      (pfVar2->Name).field_0.Ptr = pcVar11;
      (pfVar2->Name).Size = iVar7;
      pfVar2->Id = (local_38 >> ((1L << (bVar6 & 0x3f) != uVar10) + bVar6 & 0x3f)) * 0x40000 +
                   ((ulong)(local_54 & 0xff) << 0x3c);
      return pfVar2;
    }
    pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                ,99,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
}

Assistant:

file_id
ConstructFilePath(const idx2_file& Idx2, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
  //i16 BpFileKey = (BpKey * Idx2.BitPlanesPerChunk) / Idx2.BitPlanesPerFile;
#define idx2_PrintLevel idx2_Print(&Pr, "/L%02x", Level);
#define idx2_PrintBrick                                                                            \
  for (int Depth = 0; Depth + 1 < Idx2.FilesDirsDepth[Level].Len; ++Depth)                         \
  {                                                                                                \
    int BitLen =                                                                                   \
      idx2_BitSizeOf(u64) - Idx2.BricksOrderStr[Level].Len + Idx2.FilesDirsDepth[Level][Depth];    \
    idx2_Print(&Pr, "/B%" PRIx64, TakeFirstBits(Brick, BitLen));                                   \
    Brick <<= Idx2.FilesDirsDepth[Level][Depth];                                                   \
    Shift += Idx2.FilesDirsDepth[Level][Depth];                                                    \
  }
#define idx2_PrintExtension idx2_Print(&Pr, ".bin");
  u64 BrickBackup = Brick;
  int Shift = 0;
  thread_local static char FilePath[256];
  printer Pr(FilePath, sizeof(FilePath));
  idx2_Print(&Pr, "%.*s/%s/%s/", Idx2.Dir.Size, Idx2.Dir.ConstPtr, Idx2.Name, Idx2.Field);
  idx2_PrintLevel;
  idx2_PrintBrick;
  idx2_PrintExtension;
  u64 FileId = GetFileAddress(Idx2, BrickBackup, Level, Subband, BpKey);
  return file_id{ stref{ FilePath, Pr.Size }, FileId };
#undef idx2_PrintLevel
#undef idx2_PrintBrick
#undef idx2_PrintSubband
#undef idx2_PrintBitPlane
#undef idx2_PrintExtension
}